

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcxx.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"GNU GCC libstdc++",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return 0;
}

Assistant:

int main()
{
  std::cout
#ifdef _LIBCPP_VERSION
  << "LLVM libc++"
#elif defined(_GLIBCXX_RELEASE)
  << "GNU GCC libstdc++"
#elif defined(_MSVC_STL_UPDATE)
  << "Microsoft STL"
#endif
  << " " << libcxx_release() << "\n";

  return EXIT_SUCCESS;
}